

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_test.c
# Opt level: O2

void test_wait_n(testing t)

{
  int iVar1;
  nsync_time nVar2;
  nsync_time nVar3;
  nsync_time nVar4;
  nsync_time nVar5;
  closure_t_notify_0 a0;
  testing t_00;
  uint uVar6;
  nsync_counter c;
  nsync_counter pnVar7;
  closure *pcVar8;
  nsync_note pnVar9;
  nsync_note pnVar10;
  char *pcVar11;
  long lVar12;
  nsync_counter pnVar13;
  long lVar14;
  closure_t_notify_2 in_R8;
  ulong uVar15;
  int iVar16;
  long lVar17;
  bool bVar18;
  nsync_time nVar19;
  nsync_time nVar20;
  nsync_time abs_deadline;
  closure_t_notify_1 a1;
  nsync_time abs_deadline_00;
  nsync_time abs_deadline_01;
  closure_t_notify_1 a1_00;
  nsync_time abs_deadline_02;
  nsync_time abs_deadline_03;
  nsync_waitable_s **in_stack_ffffffffffffff80;
  undefined8 local_78;
  void *pvStack_70;
  undefined8 local_68;
  void *pvStack_60;
  nsync_counter local_50;
  closure_t_notify_0 local_48;
  int local_3c;
  testing local_38;
  
  local_38 = t;
  for (local_3c = 0; local_3c != 0x1e; local_3c = local_3c + 1) {
    c = nsync::nsync_counter_new(0);
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
    pvStack_70 = (void *)0x0;
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    pvStack_60 = (void *)0x0;
    nVar19 = nsync::nsync_time_now();
    nVar20 = nsync::nsync_time_ms(100);
    pnVar13 = (nsync_counter)nVar20.tv_nsec;
    nVar19 = nsync::nsync_time_add(nVar19,nVar20);
    iVar1 = (uint)local_78 + 10;
    while (local_50 = (nsync_counter)nVar19.tv_nsec, local_48 = (closure_t_notify_0)nVar19.tv_sec,
          (int)(uint)local_78 < iVar1) {
      pnVar7 = nsync::nsync_counter_new(0);
      a_ensure_(&local_78,1,0x10);
      lVar12 = (long)(int)(uint)local_78;
      local_78._0_4_ = (uint)local_78 + 1;
      pnVar13 = (nsync_counter)(lVar12 * 0x10);
      *(nsync_counter *)((long)pvStack_70 + (long)pnVar13) = pnVar7;
      *(undefined1 **)((long)pvStack_70 + (long)&pnVar13->counter_mu) =
           nsync::nsync_counter_waitable_funcs;
      iVar16 = 4;
      while( true ) {
        nVar2.tv_nsec = (__syscall_slong_t)local_50;
        nVar2.tv_sec = (__time_t)local_48;
        nVar19.tv_nsec = (__syscall_slong_t)local_50;
        nVar19.tv_sec = (__time_t)local_48;
        bVar18 = iVar16 == 0;
        iVar16 = iVar16 + -1;
        if ((bVar18) || (nVar19 = nVar2, iVar1 <= (int)(uint)local_78)) break;
        nsync::nsync_counter_add(pnVar7,1);
        nsync::nsync_counter_add(c,1);
        pcVar8 = (closure *)malloc(0x30);
        pcVar8->f0 = closure_f0_decrement;
        pcVar8[1].f0 = decrement_at;
        pcVar8[2].f0 = (_func_void_void_ptr *)pnVar7;
        pcVar8[3].f0 = (_func_void_void_ptr *)local_48;
        pcVar8[4].f0 = (_func_void_void_ptr *)local_50;
        pcVar8[5].f0 = (_func_void_void_ptr *)c;
        pnVar13 = local_50;
        closure_fork(pcVar8);
      }
    }
    iVar1 = (uint)local_78 + 10;
    while (local_50 = (nsync_counter)nVar19.tv_nsec, local_48 = (closure_t_notify_0)nVar19.tv_sec,
          (int)(uint)local_78 < iVar1) {
      abs_deadline.tv_nsec = (__syscall_slong_t)pnVar13;
      abs_deadline.tv_sec = 999999999;
      pnVar9 = nsync::nsync_note_new((nsync *)0x0,(nsync_note)0x7fffffffffffffff,abs_deadline);
      a_ensure_(&local_78,1,0x10);
      lVar12 = (long)(int)(uint)local_78;
      local_78._0_4_ = (uint)local_78 + 1;
      *(nsync_note *)((long)pvStack_70 + lVar12 * 0x10) = pnVar9;
      *(undefined ***)((long)pvStack_70 + lVar12 * 0x10 + 8) = &nsync::nsync_note_waitable_funcs;
      nsync::nsync_counter_add(c,1);
      a1.tv_nsec = (__syscall_slong_t)c;
      a1.tv_sec = (__time_t)local_50;
      pnVar13 = c;
      pcVar8 = closure_notify((_func_void_closure_t_notify_0_closure_t_notify_1_closure_t_notify_2 *
                              )pnVar9,local_48,a1,in_R8);
      closure_fork(pcVar8);
      iVar16 = 4;
      while( true ) {
        nVar3.tv_nsec = (__syscall_slong_t)local_50;
        nVar3.tv_sec = (__time_t)local_48;
        nVar19.tv_nsec = (__syscall_slong_t)local_50;
        nVar19.tv_sec = (__time_t)local_48;
        bVar18 = iVar16 == 0;
        iVar16 = iVar16 + -1;
        if ((bVar18) || (nVar19 = nVar3, iVar1 <= (int)(uint)local_78)) break;
        abs_deadline_00.tv_nsec = (__syscall_slong_t)pnVar13;
        abs_deadline_00.tv_sec = 999999999;
        pnVar10 = nsync::nsync_note_new
                            ((nsync *)pnVar9,(nsync_note)0x7fffffffffffffff,abs_deadline_00);
        a_ensure_(&local_78,1,0x10);
        lVar12 = (long)(int)(uint)local_78;
        local_78._0_4_ = (uint)local_78 + 1;
        pnVar13 = (nsync_counter)(lVar12 * 0x10);
        *(nsync_note *)((long)pvStack_70 + (long)pnVar13) = pnVar10;
        *(undefined ***)((long)pvStack_70 + (long)&pnVar13->counter_mu) =
             &nsync::nsync_note_waitable_funcs;
      }
    }
    iVar1 = (uint)local_78 + 10;
    while (t_00 = local_38, local_50 = (nsync_counter)nVar19.tv_nsec, pnVar7 = local_50,
          local_48 = (closure_t_notify_0)nVar19.tv_sec, a0 = local_48, (int)(uint)local_78 < iVar1)
    {
      abs_deadline_01.tv_nsec = (__syscall_slong_t)pnVar13;
      abs_deadline_01.tv_sec = (__time_t)local_50;
      pnVar9 = nsync::nsync_note_new((nsync *)0x0,local_48,abs_deadline_01);
      a_ensure_(&local_78,1,0x10);
      lVar12 = (long)(int)(uint)local_78;
      local_78._0_4_ = (uint)local_78 + 1;
      *(nsync_note *)((long)pvStack_70 + lVar12 * 0x10) = pnVar9;
      *(undefined ***)((long)pvStack_70 + lVar12 * 0x10 + 8) = &nsync::nsync_note_waitable_funcs;
      nsync::nsync_counter_add(c,1);
      a1_00.tv_nsec = (__syscall_slong_t)c;
      a1_00.tv_sec = (__time_t)pnVar7;
      pnVar13 = c;
      pcVar8 = closure_notify((_func_void_closure_t_notify_0_closure_t_notify_1_closure_t_notify_2 *
                              )pnVar9,a0,a1_00,in_R8);
      closure_fork(pcVar8);
      iVar16 = 4;
      while( true ) {
        nVar4.tv_nsec = (__syscall_slong_t)local_50;
        nVar4.tv_sec = (__time_t)local_48;
        nVar19.tv_nsec = (__syscall_slong_t)local_50;
        nVar19.tv_sec = (__time_t)local_48;
        bVar18 = iVar16 == 0;
        iVar16 = iVar16 + -1;
        if ((bVar18) || (nVar19 = nVar4, iVar1 <= (int)(uint)local_78)) break;
        abs_deadline_02.tv_nsec = (__syscall_slong_t)pnVar13;
        abs_deadline_02.tv_sec = 999999999;
        pnVar10 = nsync::nsync_note_new
                            ((nsync *)pnVar9,(nsync_note)0x7fffffffffffffff,abs_deadline_02);
        a_ensure_(&local_78,1,0x10);
        lVar12 = (long)(int)(uint)local_78;
        local_78._0_4_ = (uint)local_78 + 1;
        pnVar13 = (nsync_counter)(lVar12 * 0x10);
        *(nsync_note *)((long)pvStack_70 + (long)pnVar13) = pnVar10;
        *(undefined ***)((long)pvStack_70 + (long)&pnVar13->counter_mu) =
             &nsync::nsync_note_waitable_funcs;
      }
    }
    if ((uint)local_78 != 0x1e) {
      pcVar11 = smprintf("array length not equal to number of counters");
      testing_error_(t_00,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/wait_test.c"
                     ,0x66,pcVar11);
      nVar19.tv_nsec = (__syscall_slong_t)local_50;
      nVar19.tv_sec = (__time_t)local_48;
    }
    lVar12 = 0;
    for (uVar15 = 0; local_50 = (nsync_counter)nVar19.tv_nsec,
        local_48 = (closure_t_notify_0)nVar19.tv_sec, uVar15 != (uint)local_78; uVar15 = uVar15 + 1)
    {
      lVar17 = (long)pvStack_70 + lVar12;
      a_ensure_(&local_68,1,8);
      nVar19.tv_nsec = (__syscall_slong_t)local_50;
      nVar19.tv_sec = (__time_t)local_48;
      lVar14 = (long)(int)(uint)local_68;
      local_68._0_4_ = (uint)local_68 + 1;
      *(long *)((long)pvStack_60 + lVar14 * 8) = lVar17;
      lVar12 = lVar12 + 0x10;
    }
    uVar15 = (ulong)(uint)local_68;
    while( true ) {
      local_50 = (nsync_counter)nVar19.tv_nsec;
      local_48 = (closure_t_notify_0)nVar19.tv_sec;
      in_R8 = (closure_t_notify_2)0x3b9ac9ff;
      if ((int)uVar15 == 0) break;
      abs_deadline_03.tv_nsec = uVar15;
      abs_deadline_03.tv_sec = 999999999;
      uVar6 = nsync::nsync_wait_n((nsync *)0x0,(void *)0x0,(_func_void_void_ptr *)0x0,
                                  (_func_void_void_ptr *)0x7fffffffffffffff,abs_deadline_03,
                                  (int)pvStack_60,in_stack_ffffffffffffff80);
      if (uVar6 == (uint)local_68) {
        pcVar11 = smprintf("nsync_wait_n returned with no waiter ready");
        testing_error_(t_00,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/wait_test.c"
                       ,0x6f,pcVar11);
      }
      nVar19.tv_nsec = (__syscall_slong_t)local_50;
      nVar19.tv_sec = (__time_t)local_48;
      nVar5.tv_nsec = (__syscall_slong_t)local_50;
      nVar5.tv_sec = (__time_t)local_48;
      uVar15 = (ulong)(uint)local_68;
      *(undefined8 *)((long)pvStack_60 + (long)(int)uVar6 * 8) =
           *(undefined8 *)((long)pvStack_60 + (long)(int)(uint)local_68 * 8 + -8);
      if ((int)(uint)local_68 < 1) {
        _DAT_00000000 = 0;
      }
      else {
        local_68._0_4_ = (uint)local_68 - 1;
        uVar15 = (ulong)(uint)local_68;
        nVar19 = nVar5;
      }
    }
    nVar20.tv_nsec = 0x7fffffffffffffff;
    nVar20.tv_sec = 999999999;
    nsync::nsync_counter_wait((nsync *)c,(nsync_counter)0x7fffffffffffffff,nVar20);
    for (lVar12 = 0; lVar12 != 0xa0; lVar12 = lVar12 + 0x10) {
      nsync::nsync_counter_free(*(nsync_counter *)((long)pvStack_70 + lVar12));
    }
    lVar14 = 0xa0;
    for (lVar12 = 10; lVar12 < (int)(uint)local_78; lVar12 = lVar12 + 1) {
      nsync::nsync_note_free(*(nsync_note *)((long)pvStack_70 + lVar14));
      lVar14 = lVar14 + 0x10;
    }
    if (0 < local_68._4_4_) {
      free(pvStack_60);
    }
    local_68 = 0;
    pvStack_60 = (void *)0x0;
    if (0 < local_78._4_4_) {
      free(pvStack_70);
    }
    local_78 = 0;
    pvStack_70 = (void *)0x0;
    nsync::nsync_counter_free(c);
  }
  return;
}

Assistant:

static void test_wait_n (testing t) {
	int i;
	int j;
	int k;
	int ncounter = 10;
	int nnote = 10;
	int nnote_expire = 10;
	for (i = 0; i != 30; i++) {
		nsync_counter done = nsync_counter_new (0);
		nsync_time now;
		nsync_time deadline;
		a_waitable aw;
		a_pwaitable apw;
		memset (&aw, 0, sizeof (aw));
		memset (&apw, 0, sizeof (apw));
		now = nsync_time_now ();
		deadline = nsync_time_add (now, nsync_time_ms (100));
		for (j = A_LEN (&aw); A_LEN (&aw) < j+ncounter;) {
			nsync_counter c = nsync_counter_new (0);
			struct nsync_waitable_s *w = &A_PUSH (&aw);
			w->v = c;
			w->funcs = &nsync_counter_waitable_funcs;
			for (k = 0; k != 4 && A_LEN (&aw) < j+ncounter; k++) {
				nsync_counter_add (c, 1);
				nsync_counter_add (done, 1);
				closure_fork (closure_decrement (&decrement_at, c, deadline, done));
			}
		}
		for (j = A_LEN (&aw); A_LEN (&aw) < j+nnote;) {
			nsync_note n = nsync_note_new (NULL, nsync_time_no_deadline);
			struct nsync_waitable_s *w = &A_PUSH (&aw);
			w->v = n;
			w->funcs = &nsync_note_waitable_funcs;
			nsync_counter_add (done, 1);
			closure_fork (closure_notify (&notify_at, n, deadline, done));
			for (k = 0; k != 4 && A_LEN (&aw) < j+nnote; k++) {
				nsync_note cn = nsync_note_new (n, nsync_time_no_deadline);
				struct nsync_waitable_s *lw = &A_PUSH (&aw);
				lw->v = cn;
				lw->funcs = &nsync_note_waitable_funcs;
			}
		}
		for (j = A_LEN (&aw); A_LEN (&aw) < j+nnote_expire;) {
			nsync_note n = nsync_note_new (NULL, deadline);
			struct nsync_waitable_s *w = &A_PUSH (&aw);
			w->v = n;
			w->funcs = &nsync_note_waitable_funcs;
			nsync_counter_add (done, 1);
			closure_fork (closure_notify (&notify_at, n, deadline, done));
			for (k = 0; k != 4 && A_LEN (&aw) < j+nnote; k++) {
				nsync_note cn = nsync_note_new (n, nsync_time_no_deadline);
				struct nsync_waitable_s *lw = &A_PUSH (&aw);
				lw->v = cn;
				lw->funcs = &nsync_note_waitable_funcs;
			}
		}
		if (ncounter + nnote + nnote_expire != A_LEN (&aw)) {
			TEST_ERROR (t, ("array length not equal to number of counters"));
		}
		for (j = 0; j != A_LEN (&aw); j++) {
			A_PUSH (&apw) = &A (&aw, j);
		}
		while (A_LEN (&apw) != 0) {
			k = nsync_wait_n (NULL, NULL, NULL, nsync_time_no_deadline,
					  A_LEN (&apw), &A (&apw, 0));
			if (k == A_LEN (&apw)) {
				TEST_ERROR (t, ("nsync_wait_n returned with no waiter ready"));
			}
			A (&apw, k) = A (&apw, A_LEN (&apw) - 1);
			A_DISCARD (&apw, 1);
		}
		nsync_counter_wait (done, nsync_time_no_deadline);
		for (k = 0; k != ncounter; k++) {
			nsync_counter_free ((nsync_counter) A (&aw, k).v);
		}
		for (; k < A_LEN (&aw); k++) {
			nsync_note_free ((nsync_note) A (&aw, k).v);
		}
		A_FREE (&apw);
		A_FREE (&aw);
		nsync_counter_free (done);
	}
}